

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createCompositeInsert
          (Builder *this,Id object,Id composite,Id typeId,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indexes)

{
  int iVar1;
  Id IVar2;
  Instruction *pIVar3;
  size_type sVar4;
  const_reference pvVar5;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  int local_34;
  Instruction *pIStack_30;
  int i;
  Instruction *insert;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indexes_local;
  Id local_18;
  Id typeId_local;
  Id composite_local;
  Id object_local;
  Builder *this_local;
  
  insert = (Instruction *)indexes;
  indexes_local._4_4_ = typeId;
  local_18 = composite;
  typeId_local = object;
  _composite_local = this;
  pIVar3 = (Instruction *)::operator_new(0x60);
  IVar2 = getUniqueId(this);
  spv::Instruction::Instruction(pIVar3,IVar2,indexes_local._4_4_,OpCompositeInsert);
  pIStack_30 = pIVar3;
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)insert);
  spv::Instruction::reserveOperands(pIVar3,sVar4 + 2);
  spv::Instruction::addIdOperand(pIStack_30,typeId_local);
  spv::Instruction::addIdOperand(pIStack_30,local_18);
  local_34 = 0;
  while( true ) {
    iVar1 = local_34;
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)insert);
    pIVar3 = pIStack_30;
    if ((int)sVar4 <= iVar1) break;
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)insert,(long)local_34
                       );
    spv::Instruction::addImmediateOperand(pIVar3,*pvVar5);
    local_34 = local_34 + 1;
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_40,
             pIStack_30);
  addInstruction(this,&local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_40);
  IVar2 = spv::Instruction::getResultId(pIStack_30);
  return IVar2;
}

Assistant:

Id Builder::createCompositeInsert(Id object, Id composite, Id typeId, const std::vector<unsigned>& indexes)
{
    Instruction* insert = new Instruction(getUniqueId(), typeId, OpCompositeInsert);
    insert->reserveOperands(indexes.size() + 2);
    insert->addIdOperand(object);
    insert->addIdOperand(composite);
    for (int i = 0; i < (int)indexes.size(); ++i)
        insert->addImmediateOperand(indexes[i]);
    addInstruction(std::unique_ptr<Instruction>(insert));

    return insert->getResultId();
}